

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CodeChangeCount(Vdbe *v,int regCounter,char *zColName)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  char *in_RDI;
  undefined4 in_stack_00000008;
  undefined4 in_stack_fffffffffffffff0;
  
  sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20))
  ;
  sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),
                    (int)in_RDX,0);
  sqlite3VdbeSetNumCols
            ((Vdbe *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20));
  sqlite3VdbeSetColName
            ((Vdbe *)CONCAT44(regCounter,in_stack_00000008),zColName._4_4_,(int)zColName,in_RDI,
             (_func_void_void_ptr *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeChangeCount(Vdbe *v, int regCounter, const char *zColName){
  sqlite3VdbeAddOp0(v, OP_FkCheck);
  sqlite3VdbeAddOp2(v, OP_ResultRow, regCounter, 1);
  sqlite3VdbeSetNumCols(v, 1);
  sqlite3VdbeSetColName(v, 0, COLNAME_NAME, zColName, SQLITE_STATIC);
}